

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void nite::addProgram(uint T,GLuint ProgramId,Uniform *uniforms,string *name,Shader *ref)

{
  Uniform local_258;
  Program local_158;
  Shader *local_28;
  Shader *ref_local;
  string *name_local;
  Uniform *uniforms_local;
  GLuint ProgramId_local;
  uint T_local;
  
  local_28 = ref;
  ref_local = (Shader *)name;
  name_local = &uniforms->shaderName;
  uniforms_local._0_4_ = ProgramId;
  uniforms_local._4_4_ = T;
  Uniform::Uniform(&local_258,uniforms);
  Program::Program(&local_158,ProgramId,&local_258,(string *)ref_local,local_28);
  std::vector<nite::Program,_std::allocator<nite::Program>_>::push_back
            (&targets[T].programs,&local_158);
  Program::~Program(&local_158);
  Uniform::~Uniform(&local_258);
  return;
}

Assistant:

void addProgram(unsigned T, GLuint ProgramId, Uniform uniforms, const String &name, nite::Shader *ref){
        targets[T].programs.push_back(Program(ProgramId, uniforms, name, ref));
	}